

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_filetime.c
# Opt level: O3

int getfiletime(char *filename,GlobalConfig *global,curl_off_t *stamp)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  stat statbuf;
  stat64 local_a0;
  
  iVar1 = stat64(filename,&local_a0);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    warnf(global,"Failed to get filetime: %s",pcVar3);
  }
  else {
    *stamp = local_a0.st_mtim.tv_sec;
  }
  return (uint)(iVar1 == -1);
}

Assistant:

int getfiletime(const char *filename, struct GlobalConfig *global,
                curl_off_t *stamp)
{
  int rc = 1;

/* Windows stat() may attempt to adjust the Unix GMT file time by a daylight
   saving time offset and since it is GMT that is bad behavior. When we have
   access to a 64-bit type we can bypass stat and get the times directly. */
#if defined(_WIN32) && !defined(CURL_WINDOWS_UWP)
  HANDLE hfile;
  TCHAR *tchar_filename = curlx_convert_UTF8_to_tchar(filename);

  hfile = CreateFile(tchar_filename, FILE_READ_ATTRIBUTES,
                      (FILE_SHARE_READ | FILE_SHARE_WRITE |
                       FILE_SHARE_DELETE),
                      NULL, OPEN_EXISTING, 0, NULL);
  curlx_unicodefree(tchar_filename);
  if(hfile != INVALID_HANDLE_VALUE) {
    FILETIME ft;
    if(GetFileTime(hfile, NULL, NULL, &ft)) {
      curl_off_t converted = (curl_off_t)ft.dwLowDateTime
        | ((curl_off_t)ft.dwHighDateTime) << 32;

      if(converted < CURL_OFF_T_C(116444736000000000))
        warnf(global, "Failed to get filetime: underflow");
      else {
        *stamp = (converted - CURL_OFF_T_C(116444736000000000)) / 10000000;
        rc = 0;
      }
    }
    else {
      warnf(global, "Failed to get filetime: "
            "GetFileTime failed: GetLastError %u",
            (unsigned int)GetLastError());
    }
    CloseHandle(hfile);
  }
  else if(GetLastError() != ERROR_FILE_NOT_FOUND) {
    warnf(global, "Failed to get filetime: "
          "CreateFile failed: GetLastError %u",
          (unsigned int)GetLastError());
  }
#else
  struct_stat statbuf;
  if(-1 != stat(filename, &statbuf)) {
    *stamp = (curl_off_t)statbuf.st_mtime;
    rc = 0;
  }
  else
    warnf(global, "Failed to get filetime: %s", strerror(errno));
#endif
  return rc;
}